

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

void __thiscall OpenMD::FragmentStamp::checkInversions(FragmentStamp *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  InversionStamp *this_00;
  size_type sVar5;
  ostream *poVar6;
  undefined8 uVar7;
  reference piVar8;
  reference pvVar9;
  OpenMDException *this_01;
  string *msg;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::tuple<int,_int,_int,_int>_>,_bool> pVar10;
  type_conflict *fourth;
  type_conflict *third;
  type_conflict *second;
  type_conflict *first;
  tuple<int,_int,_int,_int> inversionTuple;
  vector<int,_std::allocator<int>_> inversion;
  int cent;
  InversionStamp *inversionStamp_3;
  size_t i_3;
  iterator iter;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allInversions;
  int rigidbodyIndex;
  iterator j_2;
  vector<int,_std::allocator<int>_> rigidSet;
  vector<int,_std::allocator<int>_> inversionAtoms_1;
  InversionStamp *inversionStamp_2;
  size_t i_2;
  iterator k;
  iterator j_1;
  vector<int,_std::allocator<int>_> inversionAtoms;
  InversionStamp *inversionStamp_1;
  size_t i_1;
  int b;
  int a;
  BondStamp *bondStamp;
  size_t j;
  vector<int,_std::allocator<int>_> satellites;
  int center;
  InversionStamp *inversionStamp;
  size_t i;
  ostringstream oss;
  FragmentStamp *in_stack_fffffffffffff848;
  FragmentStamp *in_stack_fffffffffffff850;
  const_iterator in_stack_fffffffffffff858;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff860;
  value_type *in_stack_fffffffffffff868;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff870;
  undefined7 in_stack_fffffffffffff878;
  undefined1 in_stack_fffffffffffff87f;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff880;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff888;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff8f0;
  bool local_669;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9f8;
  InversionStamp *sats;
  string local_570 [32];
  string local_550 [32];
  _Base_ptr local_530;
  undefined1 local_528;
  _Self local_520;
  _Base_ptr local_518;
  __tuple_element_t<3UL,_tuple<int,_int,_int,_int>_> *local_510;
  int *local_508;
  __tuple_element_t<1UL,_tuple<int,_int,_int,_int>_> *local_500;
  __tuple_element_t<0UL,_tuple<int,_int,_int,_int>_> *local_4f8;
  undefined1 *local_4f0;
  undefined1 local_4e8 [16];
  vector<int,_std::allocator<int>_> local_4d8;
  int local_4bc;
  InversionStamp *local_4b8;
  ulong local_4b0;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int,_int>_> local_4a8 [7];
  undefined1 local_469;
  string local_448 [36];
  int local_424;
  int *local_420;
  int *local_418;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_410;
  undefined4 local_404;
  vector<int,_std::allocator<int>_> local_400;
  int local_3e4;
  InversionStamp *local_3c8;
  ulong local_3c0;
  undefined1 local_3b1;
  string local_390 [32];
  string local_370 [39];
  undefined1 local_349;
  string local_328 [32];
  string local_308 [32];
  int *local_2e8;
  int *local_2e0;
  undefined4 local_2d8;
  int *local_2c8;
  int *local_2c0;
  int *local_2b8;
  long local_2b0;
  int *local_290;
  int *local_288;
  int *local_280;
  int *local_278;
  int local_26c;
  int *local_268;
  InversionStamp *local_240;
  ulong local_238;
  undefined1 local_229;
  string local_208 [32];
  int *local_1e8;
  int *local_1e0;
  int local_1d8;
  int local_1d4;
  BondStamp *local_1d0;
  InversionStamp *local_1c8;
  vector<int,_std::allocator<int>_> local_1c0;
  int local_1a4;
  InversionStamp *local_1a0;
  ulong local_188;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_188 = 0;
  do {
    uVar1 = local_188;
    sVar4 = getNInversions((FragmentStamp *)0x30b595);
    if (sVar4 <= uVar1) {
      local_238 = 0;
      while( true ) {
        uVar1 = local_238;
        sVar4 = getNInversions((FragmentStamp *)0x30ba14);
        if (sVar4 <= uVar1) {
          local_3c0 = 0;
          do {
            uVar1 = local_3c0;
            sVar4 = getNInversions((FragmentStamp *)0x30c135);
            if (sVar4 <= uVar1) {
              std::
              set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
              ::set((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                     *)0x30c5da);
              std::_Rb_tree_const_iterator<std::tuple<int,_int,_int,_int>_>::_Rb_tree_const_iterator
                        (local_4a8);
              local_4b0 = 0;
              while( true ) {
                uVar1 = local_4b0;
                sVar4 = getNInversions((FragmentStamp *)0x30c60d);
                if (sVar4 <= uVar1) {
                  std::
                  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                  ::~set((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                          *)0x30cab6);
                  std::__cxx11::ostringstream::~ostringstream(local_180);
                  return;
                }
                local_4b8 = getInversionStamp(in_stack_fffffffffffff850,
                                              (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
                local_4bc = InversionStamp::getCenter(local_4b8);
                InversionStamp::getSatellites((InversionStamp *)in_stack_fffffffffffff848);
                std::vector<int,_std::allocator<int>_>::operator[](&local_4d8,0);
                std::vector<int,_std::allocator<int>_>::operator[](&local_4d8,1);
                std::vector<int,_std::allocator<int>_>::operator[](&local_4d8,2);
                std::tuple<int,_int,_int,_int>::tuple<int_&,_int_&,_int_&,_int_&,_true,_true>
                          ((tuple<int,_int,_int,_int> *)in_stack_fffffffffffff860._M_current,
                           in_stack_fffffffffffff858._M_current,(int *)in_stack_fffffffffffff850,
                           (int *)in_stack_fffffffffffff848,(int *)0x30c6e5);
                local_4f0 = local_4e8;
                local_4f8 = std::get<0ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x30c702);
                local_500 = std::get<1ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x30c717);
                local_508 = std::get<2ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x30c72c);
                local_510 = std::get<3ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x30c741);
                if (*local_510 < *local_508) {
                  std::swap<int>(local_508,local_510);
                }
                if (*local_508 < *local_500) {
                  std::swap<int>(local_500,local_508);
                }
                if (*local_510 < *local_508) {
                  std::swap<int>(local_508,local_510);
                }
                local_518 = (_Base_ptr)
                            std::
                            set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                            ::find((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                    *)in_stack_fffffffffffff858._M_current,
                                   (key_type *)in_stack_fffffffffffff850);
                local_4a8[0]._M_node = local_518;
                local_520._M_node =
                     (_Base_ptr)
                     std::
                     set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                     ::end((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                            *)in_stack_fffffffffffff848);
                bVar2 = std::operator==(local_4a8,&local_520);
                if (!bVar2) break;
                pVar10 = std::
                         set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                         ::insert((set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                   *)in_stack_fffffffffffff870._M_current,in_stack_fffffffffffff868)
                ;
                local_530 = (_Base_ptr)pVar10.first._M_node;
                local_528 = pVar10.second;
                std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff860._M_current
                          );
                local_4b0 = local_4b0 + 1;
              }
              poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
              getName_abi_cxx11_(in_stack_fffffffffffff848);
              poVar6 = std::operator<<(poVar6,local_550);
              this_01 = (OpenMDException *)std::operator<<(poVar6,": ");
              msg = (string *)std::operator<<((ostream *)this_01,"Inversion");
              containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff9f8);
              poVar6 = std::operator<<((ostream *)msg,local_570);
              std::operator<<(poVar6," appears multiple times\n");
              std::__cxx11::string::~string(local_570);
              std::__cxx11::string::~string(local_550);
              uVar7 = __cxa_allocate_exception(0x28);
              std::__cxx11::ostringstream::str();
              OpenMDException::OpenMDException(this_01,msg);
              __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
            }
            local_3c8 = getInversionStamp(in_stack_fffffffffffff850,
                                          (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
            InversionStamp::getSatellites((InversionStamp *)in_stack_fffffffffffff848);
            local_3e4 = InversionStamp::getCenter(local_3c8);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff850,
                       (value_type_conflict1 *)in_stack_fffffffffffff848);
            getNRigidBodies((FragmentStamp *)0x30c1e5);
            local_404 = 0;
            std::allocator<int>::allocator((allocator<int> *)0x30c20f);
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff870._M_current,
                       (size_type)in_stack_fffffffffffff868,in_stack_fffffffffffff860._M_current,
                       (allocator_type *)in_stack_fffffffffffff858._M_current);
            std::allocator<int>::~allocator((allocator<int> *)0x30c243);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
            __normal_iterator(&local_410);
            local_418 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                         ((vector<int,_std::allocator<int>_> *)
                                          in_stack_fffffffffffff848);
            local_410._M_current = local_418;
            while( true ) {
              local_420 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            in_stack_fffffffffffff848);
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff850,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff848);
              if (!bVar2) break;
              piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_410);
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),
                                  (long)*piVar8);
              local_424 = *pvVar9;
              if (-1 < local_424) {
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_400,(long)local_424);
                *pvVar9 = *pvVar9 + 1;
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_400,(long)local_424);
                if (3 < *pvVar9) {
                  poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
                  getName_abi_cxx11_(in_stack_fffffffffffff848);
                  poVar6 = std::operator<<(poVar6,local_448);
                  poVar6 = std::operator<<(poVar6,": inversion centered on atom ");
                  iVar3 = InversionStamp::getCenter(local_3c8);
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
                  poVar6 = std::operator<<(poVar6," has four atoms that belong to same rigidbody ");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_424);
                  std::operator<<(poVar6,"\n");
                  std::__cxx11::string::~string(local_448);
                  local_469 = 1;
                  uVar7 = __cxa_allocate_exception(0x28);
                  std::__cxx11::ostringstream::str();
                  OpenMDException::OpenMDException
                            ((OpenMDException *)in_stack_fffffffffffff860._M_current,
                             (string *)in_stack_fffffffffffff858._M_current);
                  local_469 = 0;
                  __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
                }
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&local_410);
            }
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff860._M_current);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff860._M_current);
            local_3c0 = local_3c0 + 1;
          } while( true );
        }
        local_240 = getInversionStamp(in_stack_fffffffffffff850,
                                      (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
        InversionStamp::getSatellites((InversionStamp *)in_stack_fffffffffffff848);
        local_268 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff848
                                     );
        __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
        __normal_iterator<int*>
                  ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_fffffffffffff850,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   in_stack_fffffffffffff848);
        local_26c = InversionStamp::getCenter(local_240);
        local_278 = (int *)std::vector<int,_std::allocator<int>_>::insert
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff850
                                      ,in_stack_fffffffffffff858,
                                      (value_type_conflict1 *)in_stack_fffffffffffff848);
        local_288 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff848
                                     );
        local_290 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff848
                                     );
        sVar4 = getNAtoms((FragmentStamp *)0x30bb40);
        local_2b0 = sVar4 - 1;
        std::bind<std::greater<int>,std::_Placeholder<1>const&,unsigned_long>
                  ((greater<int> *)in_stack_fffffffffffff858._M_current,
                   (_Placeholder<1> *)in_stack_fffffffffffff850,
                   (unsigned_long *)in_stack_fffffffffffff848);
        local_280 = (int *)std::
                           find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                                     (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                                      (_Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)>
                                       *)CONCAT17(in_stack_fffffffffffff87f,
                                                  in_stack_fffffffffffff878));
        local_2c0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff848
                                     );
        local_2c8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff848
                                     );
        local_2d8 = 0;
        std::bind<std::less<int>,std::_Placeholder<1>const&,int>
                  ((less<int> *)in_stack_fffffffffffff858._M_current,
                   (_Placeholder<1> *)in_stack_fffffffffffff850,(int *)in_stack_fffffffffffff848);
        __first._M_current._7_1_ = in_stack_fffffffffffff87f;
        __first._M_current._0_7_ = in_stack_fffffffffffff878;
        local_2b8 = (int *)std::
                           find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>
                                     (__first,in_stack_fffffffffffff870,
                                      (_Bind<std::less<int>_(std::_Placeholder<1>,_int)> *)
                                      in_stack_fffffffffffff868);
        local_2e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff848
                                     );
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffff850,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           in_stack_fffffffffffff848);
        local_669 = true;
        if (!bVar2) {
          local_2e8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_fffffffffffff848);
          local_669 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff850,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff848);
        }
        if (local_669 != false) break;
        bVar2 = hasDuplicateElement<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff8f0)
        ;
        if (bVar2) {
          poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
          getName_abi_cxx11_(in_stack_fffffffffffff848);
          poVar6 = std::operator<<(poVar6,local_370);
          poVar6 = std::operator<<(poVar6," : atoms of inversion");
          containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff9f8);
          poVar6 = std::operator<<(poVar6,local_390);
          std::operator<<(poVar6," have duplicated indices\n");
          std::__cxx11::string::~string(local_390);
          std::__cxx11::string::~string(local_370);
          local_3b1 = 1;
          uVar7 = __cxa_allocate_exception(0x28);
          std::__cxx11::ostringstream::str();
          OpenMDException::OpenMDException
                    ((OpenMDException *)in_stack_fffffffffffff860._M_current,
                     (string *)in_stack_fffffffffffff858._M_current);
          local_3b1 = 0;
          __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff860._M_current);
        local_238 = local_238 + 1;
      }
      poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
      getName_abi_cxx11_(in_stack_fffffffffffff848);
      poVar6 = std::operator<<(poVar6,local_308);
      poVar6 = std::operator<<(poVar6,": atoms of inversion");
      containerToString<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffff9f8);
      poVar6 = std::operator<<(poVar6,local_328);
      std::operator<<(poVar6," have invalid indices\n");
      std::__cxx11::string::~string(local_328);
      std::__cxx11::string::~string(local_308);
      local_349 = 1;
      uVar7 = __cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffff860._M_current,
                 (string *)in_stack_fffffffffffff858._M_current);
      local_349 = 0;
      __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_1a0 = getInversionStamp(in_stack_fffffffffffff850,
                                  (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
    local_1a4 = InversionStamp::getCenter(local_1a0);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x30b617);
    sVar4 = InversionStamp::getNSatellites((InversionStamp *)0x30b624);
    if (sVar4 != 3) {
      local_1c8 = (InversionStamp *)0x0;
      while (sats = local_1c8, this_00 = (InversionStamp *)getNBonds((FragmentStamp *)0x30b669),
            sats < this_00) {
        local_1d0 = getBondStamp(in_stack_fffffffffffff850,
                                 (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
        local_1d4 = BondStamp::getA(local_1d0);
        local_1d8 = BondStamp::getB(local_1d0);
        if (local_1d4 == local_1a4) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff860._M_current,
                     in_stack_fffffffffffff858._M_current);
        }
        if (local_1d8 == local_1a4) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff860._M_current,
                     in_stack_fffffffffffff858._M_current);
        }
        local_1c8 = (InversionStamp *)
                    ((long)&(((_Vector_impl *)&(local_1c8->super_DataHolder)._vptr_DataHolder)->
                            super__Vector_impl_data)._M_start + 1);
      }
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_1c0);
      if (sVar5 != 3) {
        poVar6 = std::operator<<((ostream *)local_180,"Error in Fragment ");
        getName_abi_cxx11_(in_stack_fffffffffffff848);
        poVar6 = std::operator<<(poVar6,local_208);
        poVar6 = std::operator<<(poVar6,": found wrong number");
        poVar6 = std::operator<<(poVar6," of bonds for inversion center ");
        std::ostream::operator<<(poVar6,local_1a4);
        std::__cxx11::string::~string(local_208);
        local_229 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        OpenMDException::OpenMDException
                  ((OpenMDException *)in_stack_fffffffffffff860._M_current,
                   (string *)in_stack_fffffffffffff858._M_current);
        local_229 = 0;
        __cxa_throw(uVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      local_1e0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff848);
      local_1e8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff848);
      std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (in_stack_fffffffffffff860,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 in_stack_fffffffffffff858._M_current);
      InversionStamp::setSatellites(this_00,(vector<int,_std::allocator<int>_> *)sats);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff860._M_current);
    local_188 = local_188 + 1;
  } while( true );
}

Assistant:

void FragmentStamp::checkInversions() {
    std::ostringstream oss;

    // first we automatically find the other three atoms that
    // are satellites of an inversion center:

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);
      int center                     = inversionStamp->getCenter();
      std::vector<int> satellites;

      // Some inversions come pre-programmed with the satellites.  If
      // so, don't add the satellites as they are already there.

      if (inversionStamp->getNSatellites() != 3) {
        for (std::size_t j = 0; j < getNBonds(); ++j) {
          BondStamp* bondStamp = getBondStamp(j);
          int a                = bondStamp->getA();
          int b                = bondStamp->getB();

          if (a == center) { satellites.push_back(b); }
          if (b == center) { satellites.push_back(a); }
        }

        if (satellites.size() == 3) {
          std::sort(satellites.begin(), satellites.end());
          inversionStamp->setSatellites(satellites);
        } else {
          oss << "Error in Fragment " << getName() << ": found wrong number"
              << " of bonds for inversion center " << center;
          throw OpenMDException(oss.str());
        }
      }
    }

    // then we do some sanity checking on the inversions:

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);

      std::vector<int> inversionAtoms = inversionStamp->getSatellites();
      // add the central atom to the beginning of the list:
      inversionAtoms.insert(inversionAtoms.begin(),
                            inversionStamp->getCenter());

      std::vector<int>::iterator j = std::find_if(
          inversionAtoms.begin(), inversionAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(inversionAtoms.begin(), inversionAtoms.end(),
                       std::bind(std::less<int>(), placeholders::_1, 0));

      if (j != inversionAtoms.end() || k != inversionAtoms.end()) {
        oss << "Error in Fragment " << getName() << ": atoms of inversion"
            << containerToString(inversionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(inversionAtoms)) {
        oss << "Error in Fragment " << getName() << " : atoms of inversion"
            << containerToString(inversionAtoms)
            << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp  = getInversionStamp(i);
      std::vector<int> inversionAtoms = inversionStamp->getSatellites();
      inversionAtoms.push_back(inversionStamp->getCenter());
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = inversionAtoms.begin(); j != inversionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Fragment " << getName()
                << ": inversion centered on atom "
                << inversionStamp->getCenter()
                << " has four atoms that belong to same rigidbody "
                << rigidbodyIndex << "\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allInversions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;
    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);
      int cent                       = inversionStamp->getCenter();
      std::vector<int> inversion     = inversionStamp->getSatellites();

      std::tuple<int, int, int, int> inversionTuple(cent, inversion[0],
                                                    inversion[1], inversion[2]);
      auto& [first, second, third, fourth] = inversionTuple;

      // In OpenMD, the Central atom in an inversion comes first, and
      // has a special position.  The other three atoms can come in
      // random order, and should be sorted in increasing numerical
      // order to check for duplicates.  This requires three pairwise
      // swaps:
      if (third > fourth) std::swap(third, fourth);
      if (second > third) std::swap(second, third);
      if (third > fourth) std::swap(third, fourth);

      iter = allInversions.find(inversionTuple);
      if (iter == allInversions.end()) {
        allInversions.insert(inversionTuple);
      } else {
        oss << "Error in Fragment " << getName() << ": "
            << "Inversion" << containerToString(inversion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }
  }